

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric_family.h
# Opt level: O0

void __thiscall prometheus::MetricFamily::~MetricFamily(MetricFamily *this)

{
  MetricFamily *this_local;
  
  std::vector<prometheus::ClientMetric,_std::allocator<prometheus::ClientMetric>_>::~vector
            (&this->metric);
  std::__cxx11::string::~string((string *)&this->help);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

struct PROMETHEUS_CPP_CORE_EXPORT MetricFamily {
  std::string name;
  std::string help;
  MetricType type = MetricType::Untyped;
  std::vector<ClientMetric> metric;
}